

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

optional<Patch::Change> * __thiscall
Patch::get_change_starting_before_position<Patch::OldCoordinates>
          (optional<Patch::Change> *__return_storage_ptr__,Patch *this,Point target)

{
  Node *pNVar1;
  Point PVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Point PVar6;
  Point PVar7;
  Node *this_00;
  uint32_t uVar8;
  Node *this_01;
  optional<Patch::Change> *poVar9;
  Point node_old_start;
  Point node_new_start;
  PositionStackEntry left_ancestor_info;
  PositionStackEntry found_node_left_ancestor_info;
  Point local_a0;
  optional<Patch::Change> *local_98;
  Point local_90;
  Point local_88;
  PositionStackEntry local_80;
  PositionStackEntry local_68;
  Point local_50;
  Text *local_48;
  Text *pTStack_40;
  Point local_38;
  
  pNVar1 = this->root;
  local_98 = __return_storage_ptr__;
  local_38 = target;
  PositionStackEntry::PositionStackEntry(&local_80);
  PositionStackEntry::PositionStackEntry(&local_68);
  this_01 = (Node *)0x0;
  do {
    while( true ) {
      this_00 = pNVar1;
      if (this_00 == (Node *)0x0) goto LAB_00159e12;
      local_a0 = Point::traverse(&local_80.old_end,&this_00->old_distance_from_left_ancestor);
      local_88 = Point::traverse(&local_80.new_end,&this_00->new_distance_from_left_ancestor);
      local_90 = local_a0;
      bVar3 = Point::operator<=(&local_90,&local_38);
      if (!bVar3) break;
      local_68.total_new_text_size = local_80.total_new_text_size;
      local_68.total_old_text_size = local_80.total_old_text_size;
      local_68.old_end = local_80.old_end;
      local_68.new_end = local_80.new_end;
      this_01 = this_00;
      if (this_00->right == (Node *)0x0) goto LAB_00159e12;
      local_80.old_end = Point::traverse(&local_a0,&this_00->old_extent);
      local_80.new_end = Point::traverse(&local_88,&this_00->new_extent);
      uVar8 = 0;
      uVar5 = 0;
      if (this_00->left != (Node *)0x0) {
        uVar5 = this_00->left->old_subtree_text_size;
      }
      uVar4 = Node::old_text_size(this_00);
      local_80.total_old_text_size = local_80.total_old_text_size + uVar4 + uVar5;
      if (this_00->left != (Node *)0x0) {
        uVar8 = this_00->left->new_subtree_text_size;
      }
      uVar5 = Node::new_text_size(this_00);
      local_80.total_new_text_size = local_80.total_new_text_size + uVar5 + uVar8;
      pNVar1 = this_00->right;
    }
    pNVar1 = this_00->left;
  } while (this_00->left != (Node *)0x0);
LAB_00159e12:
  poVar9 = local_98;
  if (this_01 == (Node *)0x0) {
    optional<Patch::Change>::optional(local_98);
  }
  else {
    local_a0 = Point::traverse(&local_68.old_end,&this_01->old_distance_from_left_ancestor);
    local_88 = Point::traverse(&local_68.new_end,&this_01->new_distance_from_left_ancestor);
    local_50 = local_a0;
    PVar6 = Point::traverse(&local_a0,&this_01->old_extent);
    PVar2 = local_88;
    PVar7 = Point::traverse(&local_88,&this_01->new_extent);
    local_48 = (this_01->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t
               .super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    pTStack_40 = (this_01->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    pNVar1 = this_01->left;
    if (pNVar1 == (Node *)0x0) {
      uVar5 = 0;
      uVar8 = local_68.total_old_text_size;
    }
    else {
      uVar5 = pNVar1->new_subtree_text_size;
      uVar8 = local_68.total_old_text_size + pNVar1->old_subtree_text_size;
    }
    uVar5 = local_68.total_new_text_size + uVar5;
    uVar4 = Node::old_text_size(this_01);
    (local_98->value).old_start = local_50;
    (local_98->value).old_end = PVar6;
    (local_98->value).new_start = PVar2;
    (local_98->value).new_end = PVar7;
    (local_98->value).old_text = local_48;
    (local_98->value).new_text = pTStack_40;
    (local_98->value).preceding_old_text_size = uVar8;
    (local_98->value).preceding_new_text_size = uVar5;
    (local_98->value).old_text_size = uVar4;
    local_98->is_some = true;
    poVar9 = local_98;
  }
  return poVar9;
}

Assistant:

optional<Patch::Change> Patch::get_change_starting_before_position(Point target) const {
  const Node *found_node = nullptr;
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Patch::PositionStackEntry found_node_left_ancestor_info;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    if (CoordinateSpace::choose(node_old_start, node_new_start) <= target) {
      found_node = node;
      found_node_left_ancestor_info = left_ancestor_info;
      if (node->right) {
        left_ancestor_info.old_end = node_old_start.traverse(node->old_extent);
        left_ancestor_info.new_end = node_new_start.traverse(node->new_extent);
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (found_node) {
    Point old_start = found_node_left_ancestor_info.old_end.traverse(found_node->old_distance_from_left_ancestor);
    Point new_start = found_node_left_ancestor_info.new_end.traverse(found_node->new_distance_from_left_ancestor);

    return Change{
      old_start, old_start.traverse(found_node->old_extent),
      new_start, new_start.traverse(found_node->new_extent),
      found_node->old_text.get(),
      found_node->new_text.get(),
      found_node_left_ancestor_info.total_old_text_size + found_node->left_subtree_old_text_size(),
      found_node_left_ancestor_info.total_new_text_size + found_node->left_subtree_new_text_size(),
      found_node->old_text_size()
    };
  } else {
    return optional<Change>{};
  }
}